

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
BooleanOpNode::Evaluate
          (string *__return_storage_ptr__,BooleanOpNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  char *__s;
  pointer __lhs;
  ostringstream e;
  string sStack_1e8;
  string local_1c8;
  ostream local_1a8;
  
  __lhs = (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__lhs == pbVar1) {
      __s = this->successVal;
LAB_003211cb:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_1a8);
      return __return_storage_ptr__;
    }
    bVar2 = std::operator==(__lhs,this->failureVal);
    if (bVar2) {
      __s = this->failureVal;
      goto LAB_003211cb;
    }
    bVar2 = std::operator!=(__lhs,this->successVal);
    __lhs = __lhs + 1;
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar3 = std::operator<<(&local_1a8,"Parameters to $<");
      std::operator<<(poVar3,this->op);
      std::operator<<(&local_1a8,"> must resolve to either \'0\' or \'1\'.");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1c8,content);
      std::__cxx11::stringbuf::str();
      reportError(context,&local_1c8,&sStack_1e8);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker*) const override
  {
    for (std::string const& param : parameters) {
      if (param == this->failureVal) {
        return this->failureVal;
      }
      if (param != this->successVal) {
        std::ostringstream e;
        e << "Parameters to $<" << this->op;
        e << "> must resolve to either '0' or '1'.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }
    return this->successVal;
  }